

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

void __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::relax(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  ulong uVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  longlong local_90;
  undefined1 local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  uint local_78 [3];
  undefined3 uStack_6b;
  uint uStack_68;
  undefined8 uStack_63;
  undefined8 local_58;
  cpp_dec_float<50U,_int,_void> local_48;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_88,
             &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar1 = -(ulong)(*(Real *)((long)local_88 + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_48,
             (double)(~uVar1 & (ulong)(*(Real *)((long)local_88 + 0x40) * 1e-05) |
                     uVar1 & 0x3ee4f8b588e368f1),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_80);
  local_88 = (undefined1  [8])0x3fee666666666666;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
            (&(this->minStab).m_backend,(double *)local_88);
  local_58._0_4_ = cpp_dec_float_finite;
  local_58._4_4_ = 10;
  local_88 = (undefined1  [8])0x0;
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78[0] = 0;
  local_78[1] = 0;
  stack0xffffffffffffff90 = 0;
  uStack_6b = 0;
  _uStack_68 = 0;
  uStack_63 = 0;
  local_90 = 3;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
            ((cpp_dec_float<50U,_int,_void> *)local_88,&local_48,&local_90);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            (&(this->fastDelta).m_backend,(cpp_dec_float<50U,_int,_void> *)local_88);
  return;
}

Assistant:

void SPxFastRT<R>::relax()
{
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);
   minStab *= 0.95;
   fastDelta += 3 * delta_shift;
}